

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-0.c
# Opt level: O1

int CheckFromArray(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  FILE *__stream;
  char *pcVar5;
  long lVar6;
  int n;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    iVar4 = -1;
    pcVar5 = "can\'t open out.txt";
    goto LAB_001024a2;
  }
  if (testInOut[testN].n < 1) {
LAB_0010245f:
    iVar4 = HaveGarbageAtTheEnd((FILE *)__stream);
    fclose(__stream);
    if (iVar4 == 0) {
      iVar4 = 0;
      pcVar5 = "PASSED";
      goto LAB_001024a2;
    }
  }
  else {
    lVar6 = 0;
    bVar3 = true;
    do {
      pcVar5 = ScanInt((FILE *)__stream,(int *)((long)&uStack_38 + 4));
      bVar1 = false;
      bVar2 = false;
      if ((pcVar5 == "PASSED") &&
         (bVar1 = true, bVar2 = bVar3,
         *(int *)((long)testN * 0x90 + 0x10632c + lVar6 * 4) != uStack_38._4_4_)) {
        bVar2 = false;
        printf("wrong output -- ");
        bVar1 = false;
      }
    } while ((bVar1) && (lVar6 = lVar6 + 1, bVar3 = bVar2, lVar6 < testInOut[testN].n));
    if (bVar2) goto LAB_0010245f;
    fclose(__stream);
  }
  iVar4 = 1;
  pcVar5 = "FAILED";
LAB_001024a2:
  puts(pcVar5);
  testN = testN + 1;
  return iVar4;
}

Assistant:

static int CheckFromArray(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i, passed = 1;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < testInOut[testN].n; i++) {
        int n;
        if (ScanInt(out, &n) != Pass) {
            passed = 0;
            break;
        } else if (testInOut[testN].out[i] != n) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}